

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::TryDecimalStringCast<long,(char)46>
               (char *string_ptr,idx_t string_size,long *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  idx_t iVar11;
  char *pcVar12;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  int params_2;
  byte bVar13;
  ulong in_R10;
  undefined7 uVar14;
  ulong uVar15;
  ulong uVar16;
  uint params_1;
  string error;
  DecimalCastData<long> local_e0;
  ulong local_c8;
  ulong local_c0;
  long *local_b8;
  ulong local_b0;
  string local_a8;
  uint local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  CastParameters *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  params_2 = CONCAT31(in_register_00000089,scale);
  local_e0.result = 0;
  local_e0.digit_count = '\0';
  local_e0.decimal_count = '\0';
  local_e0.round_set = false;
  local_e0.should_round = false;
  local_e0.excessive_decimals = '\0';
  local_e0.exponent_type = NONE;
  local_e0.limit =
       *(StoreType_conflict1 *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000081,width) & 0xffffffff) * 8);
  uVar9 = (uint)width;
  params_1 = (uint)scale;
  local_e0.width = width;
  local_e0.scale = scale;
  local_78 = parameters;
  if (string_size != 0) {
    uVar10 = 0;
    do {
      bVar13 = string_ptr[uVar10];
      uVar4 = (uint)bVar13;
      if ((4 < uVar4 - 9) && (uVar4 != 0x20)) {
        if (uVar4 == 0x2d) {
          if (string_size - 1 != uVar10) {
            uVar3 = string_size - uVar10;
            uVar5 = 1;
            local_e0.digit_count = 0;
            local_e0.result = 0;
            goto LAB_002a8532;
          }
          DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,true>(&local_e0);
          break;
        }
        if (bVar13 == 0x30 && string_size - 1 != uVar10) {
          bVar1 = string_ptr[uVar10 + 1];
          if (bVar1 < 0x62) {
            if ((bVar1 != 0x42) && (bVar1 != 0x58)) goto LAB_002a860b;
          }
          else if ((bVar1 != 0x62) && (bVar1 != 0x78)) goto LAB_002a860b;
          if ((string_size - uVar10) - 3 < 0xfffffffffffffffe) break;
        }
        else {
LAB_002a860b:
          uVar3 = string_size - uVar10;
          uVar5 = (ulong)(bVar13 == 0x2b);
          if (uVar5 < uVar3) {
            local_e0.digit_count = 0;
            local_e0.result = 0;
            uVar6 = uVar5;
            uVar15 = uVar5;
            goto LAB_002a863b;
          }
        }
        DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,false>(&local_e0);
        break;
      }
      uVar10 = uVar10 + 1;
    } while (string_size != uVar10);
    goto LAB_002a86f6;
  }
  local_88 = 0;
  goto LAB_002a872e;
  while( true ) {
    if (string_ptr[uVar10 + 1 + uVar5] == '_') {
      if ((string_size - uVar5) - 2 == uVar10) goto LAB_002a86ec;
      uVar5 = uVar5 + 2;
      bVar13 = (string_ptr + uVar5)[uVar10] - 0x30;
      in_R10 = CONCAT71((int7)((ulong)(string_ptr + uVar5) >> 8),bVar13);
      if (9 < bVar13) goto LAB_002a86ec;
    }
    else {
      uVar5 = uVar5 + 1;
    }
    uVar7 = uVar5;
    if (uVar3 <= uVar5) break;
LAB_002a8532:
    uVar6 = CONCAT71((int7)(in_R10 >> 8),string_ptr[uVar10 + uVar5]);
    uVar4 = (uint)uVar6;
    bVar13 = (byte)(uVar4 - 0x30);
    if (9 < bVar13) {
      local_e0._11_3_ = 0;
      uVar15 = uVar5;
      if (string_ptr[uVar10 + uVar5] != '.') goto LAB_002a8a91;
      uVar16 = uVar5 + 1;
      uVar7 = uVar16;
      if (uVar3 <= uVar16) goto LAB_002a8b63;
      local_e0.should_round = false;
      local_c8 = local_c8 & 0xffffffff00000000;
      local_e0.decimal_count = 0;
      uVar15 = uVar16;
      goto LAB_002a8849;
    }
    if (bVar13 == 0 && local_e0.result == 0) {
      local_e0.result = 0;
    }
    else {
      if ((uVar9 - params_1 == (uint)local_e0.digit_count) ||
         (local_e0.digit_count = local_e0.digit_count + 1, local_e0.result < -0xccccccccccccccc))
      goto LAB_002a86ec;
      local_e0.result = local_e0.result * 10 - (ulong)(uVar4 - 0x30 & 0xff);
    }
    in_R10 = ~uVar5 + string_size;
    uVar7 = uVar3;
    if (in_R10 == uVar10) break;
  }
  local_e0._11_3_ = 0;
LAB_002a8906:
  local_b8 = result;
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,true>(&local_e0);
  if ((bVar2) && (1 < uVar7)) goto LAB_002a8a4f;
  goto LAB_002a86f6;
  while( true ) {
    if (string_ptr[uVar10 + 1 + uVar15] == '_') {
      if (((string_size - uVar15) - 2 == uVar10) ||
         (uVar15 = uVar15 + 2, 9 < (byte)(string_ptr[uVar10 + uVar15] - 0x30U))) {
        local_e0.round_set = SUB81(local_c8,0);
        goto LAB_002a8cc2;
      }
    }
    else {
      uVar15 = uVar15 + 1;
    }
    uVar7 = uVar15;
    if (uVar3 <= uVar15) break;
LAB_002a8849:
    uVar14 = (undefined7)(uVar6 >> 8);
    uVar4 = (uint)CONCAT71(uVar14,string_ptr[uVar10 + uVar15]);
    bVar13 = (byte)(uVar4 - 0x30);
    local_c0 = uVar16;
    if (9 < bVar13) {
      local_e0.round_set = local_c8._0_1_;
      local_b8 = result;
      if (uVar16 < uVar15 || 1 < uVar5) goto LAB_002a8a91;
      goto LAB_002a86f6;
    }
    if ((local_e0.decimal_count == scale) && (local_c8._0_1_ == false)) {
      local_e0.should_round = 4 < bVar13;
      local_c8 = CONCAT44(local_c8._4_4_,(int)CONCAT71(uVar14,1));
    }
    uVar6 = (ulong)((uint)local_e0.decimal_count + (uint)local_e0.digit_count);
    if ((uint)local_e0.decimal_count + (uint)local_e0.digit_count < 0x12) {
      local_e0.decimal_count = local_e0.decimal_count + 1;
      local_e0.result = local_e0.result * 10 - (ulong)(uVar4 - 0x30 & 0xff);
    }
    uVar7 = uVar3;
    if (~uVar15 + string_size == uVar10) break;
  }
  local_e0.round_set = SUB81(local_c8,0);
LAB_002a8b63:
  if ((1 < uVar5) || (local_b8 = result, uVar16 < uVar7)) goto LAB_002a8906;
  goto LAB_002a86f6;
LAB_002a8a91:
  uVar4 = uVar4 & 0xff;
  if (uVar4 < 0x20) {
    local_b8 = result;
    if (uVar4 - 9 < 5) {
LAB_002a8aa6:
      uVar15 = uVar15 + 1;
      uVar7 = uVar15;
      if (uVar15 < uVar3) {
        do {
          if ((4 < (byte)string_ptr[uVar10 + uVar15] - 9) &&
             (local_b8 = result, string_ptr[uVar10 + uVar15] != 0x20)) goto LAB_002a86f6;
          uVar15 = uVar15 + 1;
          uVar7 = uVar3;
        } while (uVar3 != uVar15);
      }
      goto LAB_002a8906;
    }
  }
  else if ((uVar4 == 0x65) || (uVar4 == 0x45)) {
    local_b8 = result;
    if ((uVar15 != 1) && (uVar15 + 1 < uVar3)) {
      local_a8._M_dataplus._M_p._0_2_ = 0;
      pcVar12 = string_ptr + uVar10 + uVar15 + 1;
      iVar11 = ~uVar10 + (string_size - uVar15);
      if (*pcVar12 == '-') {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar12,iVar11,(IntegerCastData<short> *)&local_a8,false);
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar12,iVar11,(IntegerCastData<short> *)&local_a8,false);
      }
      if (bVar2 != false) {
        bVar2 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,true>
                          (&local_e0,(int)(short)local_a8._M_dataplus._M_p);
        goto LAB_002a8d18;
      }
    }
  }
  else {
    local_b8 = result;
    if (uVar4 == 0x20) goto LAB_002a8aa6;
  }
  goto LAB_002a86f6;
  while( true ) {
    if (string_ptr[uVar10 + 1 + uVar6] == '_') {
      if ((string_size - uVar6) - 2 == uVar10) goto LAB_002a86ec;
      uVar6 = uVar6 + 2;
      bVar13 = (string_ptr + uVar6)[uVar10] - 0x30;
      uVar15 = CONCAT71((int7)((ulong)(string_ptr + uVar6) >> 8),bVar13);
      if (9 < bVar13) goto LAB_002a86ec;
    }
    else {
      uVar6 = uVar6 + 1;
    }
    uVar8 = uVar6;
    if (uVar3 <= uVar6) break;
LAB_002a863b:
    uVar15 = CONCAT71((int7)(uVar15 >> 8),string_ptr[uVar10 + uVar6]);
    uVar4 = (uint)uVar15;
    bVar13 = (byte)(uVar4 - 0x30);
    local_c8 = uVar5;
    if (9 < bVar13) {
      local_e0._11_3_ = 0;
      uVar16 = uVar6;
      if (string_ptr[uVar10 + uVar6] != '.') goto LAB_002a8bc5;
      uVar7 = uVar6 + 1;
      uVar8 = uVar7;
      if (uVar3 <= uVar7) goto LAB_002a8c98;
      local_c0 = local_c0 & 0xffffffff00000000;
      local_e0.round_set = false;
      local_e0.decimal_count = 0;
      uVar16 = uVar7;
      goto LAB_002a8972;
    }
    if (bVar13 == 0 && local_e0.result == 0) {
      local_e0.result = 0;
    }
    else {
      if ((uVar9 - params_1 == (uint)local_e0.digit_count) ||
         (local_e0.digit_count = local_e0.digit_count + 1, 0xccccccccccccccc < local_e0.result))
      goto LAB_002a86ec;
      local_e0.result = (ulong)(uVar4 - 0x30 & 0xff) + local_e0.result * 10;
    }
    uVar15 = ~uVar6 + string_size;
    uVar8 = uVar3;
    if (uVar15 == uVar10) break;
  }
  local_e0._11_3_ = 0;
LAB_002a8a2d:
  local_b8 = result;
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,false>(&local_e0);
  if ((bVar2) && (local_c8 < uVar8)) {
LAB_002a8a4f:
    *local_b8 = local_e0.result;
    return true;
  }
  goto LAB_002a86f6;
LAB_002a8bc5:
  uVar4 = uVar4 & 0xff;
  if (uVar4 < 0x20) {
    local_b8 = result;
    if (uVar4 - 9 < 5) {
LAB_002a8bda:
      uVar16 = uVar16 + 1;
      uVar8 = uVar16;
      if (uVar16 < uVar3) {
        do {
          if ((4 < (byte)string_ptr[uVar10 + uVar16] - 9) &&
             (local_b8 = result, string_ptr[uVar10 + uVar16] != 0x20)) goto LAB_002a86f6;
          uVar16 = uVar16 + 1;
          uVar8 = uVar3;
        } while (uVar3 != uVar16);
      }
      goto LAB_002a8a2d;
    }
  }
  else if ((uVar4 == 0x65) || (uVar4 == 0x45)) {
    local_b8 = result;
    if ((uVar16 != uVar5) && (uVar16 + 1 < uVar3)) {
      local_a8._M_dataplus._M_p._0_2_ = 0;
      pcVar12 = string_ptr + uVar10 + uVar16 + 1;
      iVar11 = ~uVar10 + (string_size - uVar16);
      if (*pcVar12 == '-') {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar12,iVar11,(IntegerCastData<short> *)&local_a8,false);
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar12,iVar11,(IntegerCastData<short> *)&local_a8,false);
      }
      if (bVar2 != false) {
        bVar2 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,false>
                          (&local_e0,(int)(short)local_a8._M_dataplus._M_p);
LAB_002a8d18:
        if (bVar2 != false) goto LAB_002a8a4f;
      }
    }
  }
  else {
    local_b8 = result;
    if (uVar4 == 0x20) goto LAB_002a8bda;
  }
  goto LAB_002a86f6;
LAB_002a86ec:
  local_e0._11_3_ = 0;
  local_b8 = result;
  goto LAB_002a86f6;
LAB_002a8972:
  do {
    uVar14 = (undefined7)(uVar15 >> 8);
    uVar4 = (uint)CONCAT71(uVar14,string_ptr[uVar10 + uVar16]);
    bVar13 = (byte)(uVar4 - 0x30);
    local_b0 = uVar7;
    if (9 < bVar13) {
      local_e0.should_round = (bool)(char)local_c0;
      local_b8 = result;
      if (uVar7 < uVar16 || uVar5 < uVar6) goto LAB_002a8bc5;
      goto LAB_002a86f6;
    }
    if ((local_e0.decimal_count == scale) && (local_e0.round_set == false)) {
      local_c0 = CONCAT44(local_c0._4_4_,(int)CONCAT71(uVar14,4 < bVar13));
      local_e0.round_set = true;
    }
    uVar15 = (ulong)((uint)local_e0.decimal_count + (uint)local_e0.digit_count);
    if ((uint)local_e0.decimal_count + (uint)local_e0.digit_count < 0x12) {
      local_e0.decimal_count = local_e0.decimal_count + 1;
      local_e0.result = (ulong)(uVar4 - 0x30 & 0xff) + local_e0.result * 10;
    }
    local_e0.should_round = SUB81(local_c0,0);
    uVar8 = uVar3;
    if (~uVar16 + string_size == uVar10) break;
    if (string_ptr[uVar10 + 1 + uVar16] == '_') {
      if (((string_size - uVar16) - 2 != uVar10) &&
         (uVar16 = uVar16 + 2, (byte)(string_ptr[uVar10 + uVar16] - 0x30U) < 10)) goto LAB_002a8a0f;
LAB_002a8cc2:
      local_e0.digit_count = local_e0.digit_count;
      local_e0.decimal_count = local_e0.decimal_count;
      local_e0.round_set = local_e0.round_set;
      local_b8 = result;
      goto LAB_002a86f6;
    }
    uVar16 = uVar16 + 1;
LAB_002a8a0f:
    uVar8 = uVar16;
  } while (uVar16 < uVar3);
LAB_002a8c98:
  if ((uVar5 < uVar6) || (local_b8 = result, uVar7 < uVar8)) goto LAB_002a8a2d;
LAB_002a86f6:
  local_88 = (uint)string_size;
  if (local_88 < 0xd) {
    uStack_80._4_4_ = 0;
    uStack_84 = 0;
    uStack_80._0_4_ = 0;
    if (local_88 == 0) {
LAB_002a872e:
      uStack_80._4_4_ = 0;
      uStack_80._0_4_ = 0;
      uStack_84 = 0;
      string_size = 0;
    }
    else {
      switchD_00b03519::default(&uStack_84,string_ptr,(ulong)(local_88 & 0xf));
    }
    string_ptr = (char *)&uStack_84;
    uStack_80 = (char *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
  }
  else {
    uStack_84 = *(undefined4 *)string_ptr;
    uStack_80 = string_ptr;
  }
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Could not convert string \"%s\" to DECIMAL(%d,%d)","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,string_ptr,string_ptr + (string_size & 0xffffffff));
  StringUtil::Format<std::__cxx11::string,int,int>
            (&local_a8,(StringUtil *)local_70,&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar9,
             params_1,params_2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  HandleCastError::AssignError(&local_a8,local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT62(local_a8._M_dataplus._M_p._2_6_,(short)local_a8._M_dataplus._M_p) !=
      &local_a8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT62(local_a8._M_dataplus._M_p._2_6_,(short)local_a8._M_dataplus._M_p));
  }
  return false;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}